

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O0

void mxx::impl::all2allv_big<char>
               (char *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_displs,char *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_displs,comm *comm)

{
  value_type vVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  const_reference pvVar8;
  MPI_Datatype poVar9;
  MPI_Comm poVar10;
  MPI_Request *ppoVar11;
  char *__stat_loc;
  datatype local_e0;
  undefined1 local_c8 [8];
  datatype dt_1;
  int local_a8;
  int send_to;
  int i_1;
  datatype local_98;
  undefined1 local_80 [8];
  datatype dt;
  int recv_from;
  int i;
  requests reqs;
  int tag;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_displs_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  char *out_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_displs_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes_local;
  char *msgs_local;
  
  __stat_loc = (char *)send_sizes;
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(send_sizes);
  iVar4 = mxx::comm::size(comm);
  if ((int)sVar7 != iVar4) {
    __stat_loc = 
    "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
    ;
    assert_fail("static_cast<int>(send_sizes.size()) == comm.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
                ,0x131,"all2allv_big");
  }
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(recv_sizes);
  iVar4 = mxx::comm::size(comm);
  if ((int)sVar7 != iVar4) {
    __stat_loc = 
    "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
    ;
    assert_fail("static_cast<int>(recv_sizes.size()) == comm.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
                ,0x132,"all2allv_big");
  }
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3039;
  requests::requests((requests *)&recv_from);
  dt._20_4_ = 0;
  while( true ) {
    uVar2 = dt._20_4_;
    iVar4 = mxx::comm::size(comm);
    if (iVar4 <= (int)uVar2) break;
    iVar4 = mxx::comm::rank(comm);
    iVar5 = mxx::comm::size(comm);
    iVar5 = iVar5 - dt._20_4_;
    iVar6 = mxx::comm::size(comm);
    dt._16_4_ = (iVar4 + iVar5) % iVar6;
    get_datatype<char>();
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (recv_sizes,(long)(int)dt._16_4_);
    mxx::datatype::contiguous((datatype *)local_80,&local_98,*pvVar8);
    mxx::datatype::~datatype(&local_98);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (recv_displs,(long)(int)dt._16_4_);
    vVar1 = *pvVar8;
    poVar9 = mxx::datatype::type((datatype *)local_80);
    uVar3 = reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    uVar2 = dt._16_4_;
    poVar10 = mxx::comm::operator_cast_to_ompi_communicator_t_(comm);
    ppoVar11 = requests::add((requests *)&recv_from);
    __stat_loc = (char *)0x1;
    MPI_Irecv(out + vVar1,1,poVar9,uVar2,uVar3,poVar10,ppoVar11);
    mxx::datatype::~datatype((datatype *)local_80);
    dt._20_4_ = dt._20_4_ + 1;
  }
  local_a8 = 0;
  while( true ) {
    iVar4 = mxx::comm::size(comm);
    if (iVar4 <= local_a8) break;
    iVar4 = mxx::comm::rank(comm);
    iVar5 = mxx::comm::size(comm);
    dt_1._20_4_ = (iVar4 + local_a8) % iVar5;
    get_datatype<char>();
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (send_sizes,(long)(int)dt_1._20_4_);
    mxx::datatype::contiguous((datatype *)local_c8,&local_e0,*pvVar8);
    mxx::datatype::~datatype(&local_e0);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (send_displs,(long)(int)dt_1._20_4_);
    vVar1 = *pvVar8;
    poVar9 = mxx::datatype::type((datatype *)local_c8);
    uVar3 = reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    uVar2 = dt_1._20_4_;
    poVar10 = mxx::comm::operator_cast_to_ompi_communicator_t_(comm);
    ppoVar11 = requests::add((requests *)&recv_from);
    __stat_loc = (char *)0x1;
    MPI_Isend(msgs + vVar1,1,poVar9,uVar2,uVar3,poVar10,ppoVar11);
    mxx::datatype::~datatype((datatype *)local_c8);
    local_a8 = local_a8 + 1;
  }
  requests::wait((requests *)&recv_from,__stat_loc);
  requests::~requests((requests *)&recv_from);
  return;
}

Assistant:

void all2allv_big(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& send_displs, T* out, const std::vector<size_t>& recv_sizes, const std::vector<size_t>& recv_displs, const mxx::comm& comm = mxx::comm()) {
    // point-to-point implementation
    // TODO: implement MPI_Alltoallw variant
    // TODO: try RMA
    MXX_ASSERT(static_cast<int>(send_sizes.size()) == comm.size());
    MXX_ASSERT(static_cast<int>(recv_sizes.size()) == comm.size());
    // TODO: unify tag usage
    int tag = 12345;
    // implementing this using point-to-point communication!
    // dispatch receives
    mxx::requests reqs;
    for (int i = 0; i < comm.size(); ++i) {
        // start with self send/recv
        int recv_from = (comm.rank() + (comm.size()-i)) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[recv_from]);
        MPI_Irecv(const_cast<T*>(&(*out)) + recv_displs[recv_from], 1, dt.type(),
                  recv_from, tag, comm, &reqs.add());
    }
    // dispatch sends
    for (int i = 0; i < comm.size(); ++i) {
        int send_to = (comm.rank() + i) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(send_sizes[send_to]);
        MPI_Isend(const_cast<T*>(msgs)+send_displs[send_to], 1, dt.type(), send_to,
                  tag, comm, &reqs.add());
    }

    reqs.wait();
}